

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicGraph.cpp
# Opt level: O3

list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
* __thiscall
DynamicGraph::getVirtualEdges_abi_cxx11_
          (list<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
           *__return_storage_ptr__,DynamicGraph *this)

{
  size_t *psVar1;
  _Base_ptr p_Var2;
  _List_node_base *p_Var3;
  _Rb_tree_node_base *p_Var4;
  
  (__return_storage_ptr__->
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  )._M_impl._M_node.super__List_node_base._M_prev = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  )._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)__return_storage_ptr__;
  (__return_storage_ptr__->
  super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
  )._M_impl._M_node._M_size = 0;
  for (p_Var4 = (this->virtualEdges)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != &(this->virtualEdges)._M_t._M_impl.super__Rb_tree_header;
      p_Var4 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var4)) {
    p_Var3 = (_List_node_base *)operator_new(0x28);
    p_Var3[2]._M_next = (_List_node_base *)p_Var4[1]._M_left;
    p_Var2 = p_Var4[1]._M_parent;
    p_Var3[1]._M_next = *(_List_node_base **)(p_Var4 + 1);
    p_Var3[1]._M_prev = (_List_node_base *)p_Var2;
    std::__detail::_List_node_base::_M_hook(p_Var3);
    psVar1 = &(__return_storage_ptr__->
              super__List_base<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>,_std::allocator<boost::detail::edge_desc_impl<boost::undirected_tag,_unsigned_long>_>_>
              )._M_impl._M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  return __return_storage_ptr__;
}

Assistant:

std::list<Edge> DynamicGraph::getVirtualEdges() const
{
    std::list<Edge> virtualEdgesList;
    for (const auto &virtualEdge : this->virtualEdges) {
        virtualEdgesList.push_back(virtualEdge);
    }
    return virtualEdgesList;
}